

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCGeometryCollider.cpp
# Opt level: O1

int chrono::collision::ChGeometryCollider::ComputeSphereBoxCollisions
              (ChSphere *mgeo1,Vector *c1,ChBox *mgeo2,ChMatrix33<double> *R2,Vector *T2,
              ChNarrowPhaseCollider *mcollider,bool just_intersection,bool swap_pairs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  bool bVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  Vector *pVVar39;
  Vector *pVVar40;
  int i;
  int ipoint;
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  double dVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  ChCollisionPair temp;
  Vector pt_2;
  Vector pt_1;
  double local_140;
  double local_138;
  double local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_e8 [40];
  float fStack_c0;
  undefined4 uStack_bc;
  double local_b8;
  double dStack_b0;
  float local_a8;
  float local_a4;
  float local_a0;
  Vector *local_80;
  Vector *local_78;
  ChVector<double> local_70;
  ChVector<float> local_54;
  ChVector<double> local_48;
  
  local_80 = c1;
  local_78 = T2;
  ChTransform<double>::TransformParentToLocal(c1,T2,R2);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = local_140;
  auVar43._8_8_ = 0x7fffffffffffffff;
  auVar43._0_8_ = 0x7fffffffffffffff;
  auVar43 = vandpd_avx512vl(auVar88,auVar43);
  dVar49 = (mgeo2->Size).m_data[0];
  local_128._8_8_ = 0;
  local_128._0_8_ = dVar49;
  dVar42 = mgeo1->rad;
  dVar41 = auVar43._0_8_;
  if (just_intersection) {
    if (((dVar49 + dVar42 < dVar41) ||
        (auVar89._8_8_ = 0, auVar89._0_8_ = local_138, auVar8._8_8_ = 0x7fffffffffffffff,
        auVar8._0_8_ = 0x7fffffffffffffff, auVar43 = vandpd_avx512vl(auVar89,auVar8),
        (mgeo2->Size).m_data[1] < auVar43._0_8_)) ||
       (auVar90._8_8_ = 0, auVar90._0_8_ = local_130, auVar9._8_8_ = 0x7fffffffffffffff,
       auVar9._0_8_ = 0x7fffffffffffffff, auVar43 = vandpd_avx512vl(auVar90,auVar9),
       (mgeo2->Size).m_data[2] < auVar43._0_8_)) {
      auVar91._8_8_ = 0;
      auVar91._0_8_ = local_138;
      auVar10._8_8_ = 0x7fffffffffffffff;
      auVar10._0_8_ = 0x7fffffffffffffff;
      auVar43 = vandpd_avx512vl(auVar91,auVar10);
      dVar50 = (mgeo2->Size).m_data[1];
      dVar87 = auVar43._0_8_;
      if ((((dVar49 < dVar41) || (dVar42 + dVar50 < dVar87)) ||
          (auVar97._8_8_ = 0, auVar97._0_8_ = local_130, auVar11._8_8_ = 0x7fffffffffffffff,
          auVar11._0_8_ = 0x7fffffffffffffff, auVar43 = vandpd_avx512vl(auVar97,auVar11),
          (mgeo2->Size).m_data[2] < auVar43._0_8_)) &&
         (((dVar50 < dVar87 || (dVar49 < dVar41)) ||
          (auVar98._8_8_ = 0, auVar98._0_8_ = local_130, auVar12._8_8_ = 0x7fffffffffffffff,
          auVar12._0_8_ = 0x7fffffffffffffff, auVar43 = vandpd_avx512vl(auVar98,auVar12),
          dVar42 + (mgeo2->Size).m_data[2] < auVar43._0_8_)))) {
        dVar49 = (dVar41 - dVar49) * (dVar41 - dVar49) + (dVar87 - dVar50) * (dVar87 - dVar50);
        if (dVar49 < 0.0) {
          dVar49 = sqrt(dVar49);
        }
        else {
          auVar51._8_8_ = 0;
          auVar51._0_8_ = dVar49;
          auVar43 = vsqrtsd_avx(auVar51,auVar51);
          dVar49 = auVar43._0_8_;
        }
        if ((mgeo1->rad < dVar49) ||
           (auVar52._8_8_ = 0, auVar52._0_8_ = local_130, auVar13._8_8_ = 0x7fffffffffffffff,
           auVar13._0_8_ = 0x7fffffffffffffff, auVar43 = vandpd_avx512vl(auVar52,auVar13),
           (mgeo2->Size).m_data[2] < auVar43._0_8_)) {
          auVar92._8_8_ = 0x7fffffffffffffff;
          auVar92._0_8_ = 0x7fffffffffffffff;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = local_138;
          auVar72._8_8_ = 0;
          auVar72._0_8_ = local_130;
          auVar43 = vandpd_avx(auVar53,auVar92);
          dVar49 = auVar43._0_8_ - (mgeo2->Size).m_data[1];
          auVar43 = vandpd_avx(auVar72,auVar92);
          dVar42 = auVar43._0_8_ - (mgeo2->Size).m_data[2];
          dVar49 = dVar49 * dVar49 + dVar42 * dVar42;
          if (dVar49 < 0.0) {
            dVar49 = sqrt(dVar49);
          }
          else {
            auVar54._8_8_ = 0;
            auVar54._0_8_ = dVar49;
            auVar43 = vsqrtsd_avx(auVar54,auVar54);
            dVar49 = auVar43._0_8_;
          }
          if ((mgeo1->rad < dVar49) ||
             (auVar55._8_8_ = 0, auVar55._0_8_ = local_140, auVar14._8_8_ = 0x7fffffffffffffff,
             auVar14._0_8_ = 0x7fffffffffffffff, auVar43 = vandpd_avx512vl(auVar55,auVar14),
             (mgeo2->Size).m_data[0] < auVar43._0_8_)) {
            auVar56._8_8_ = 0;
            auVar56._0_8_ = local_140;
            auVar73._8_8_ = 0;
            auVar73._0_8_ = local_130;
            auVar43 = vandpd_avx(auVar73,auVar92);
            dVar49 = auVar43._0_8_ - (mgeo2->Size).m_data[2];
            auVar43 = vandpd_avx(auVar56,auVar92);
            dVar42 = auVar43._0_8_ - (mgeo2->Size).m_data[0];
            dVar49 = dVar49 * dVar49 + dVar42 * dVar42;
            if (dVar49 < 0.0) {
              dVar49 = sqrt(dVar49);
            }
            else {
              auVar57._8_8_ = 0;
              auVar57._0_8_ = dVar49;
              auVar43 = vsqrtsd_avx(auVar57,auVar57);
              dVar49 = auVar43._0_8_;
            }
            if ((mgeo1->rad < dVar49) ||
               (auVar58._8_8_ = 0, auVar58._0_8_ = local_138, auVar15._8_8_ = 0x7fffffffffffffff,
               auVar15._0_8_ = 0x7fffffffffffffff, auVar43 = vandpd_avx512vl(auVar58,auVar15),
               (mgeo2->Size).m_data[1] < auVar43._0_8_)) {
              auVar59._8_8_ = 0;
              auVar59._0_8_ = local_140;
              auVar74._8_8_ = 0;
              auVar74._0_8_ = local_138;
              auVar80._8_8_ = 0;
              auVar80._0_8_ = local_130;
              auVar43 = vandpd_avx(auVar59,auVar92);
              dVar49 = auVar43._0_8_ - (mgeo2->Size).m_data[0];
              auVar43 = vandpd_avx(auVar74,auVar92);
              dVar42 = auVar43._0_8_ - (mgeo2->Size).m_data[1];
              auVar43 = vandpd_avx(auVar80,auVar92);
              dVar41 = auVar43._0_8_ - (mgeo2->Size).m_data[2];
              dVar49 = dVar49 * dVar49 + dVar42 * dVar42 + dVar41 * dVar41;
              if (dVar49 < 0.0) {
                dVar49 = sqrt(dVar49);
              }
              else {
                auVar60._8_8_ = 0;
                auVar60._0_8_ = dVar49;
                auVar43 = vsqrtsd_avx(auVar60,auVar60);
                dVar49 = auVar43._0_8_;
              }
              if (mgeo1->rad < dVar49) {
                return 0;
              }
            }
          }
        }
      }
    }
    ChCollisionPair::ChCollisionPair
              ((ChCollisionPair *)local_e8,&mgeo1->super_ChGeometry,(ChGeometry *)mgeo2);
    ChNarrowPhaseCollider::AddCollisionPair(mcollider,(ChCollisionPair *)local_e8);
    return 1;
  }
  auVar105 = ZEXT864(0) << 0x40;
  if (dVar41 <= dVar49 + dVar42) {
    local_118._8_8_ = 0;
    local_118._0_8_ = local_138;
    auVar16._8_8_ = 0x7fffffffffffffff;
    auVar16._0_8_ = 0x7fffffffffffffff;
    auVar43 = vandpd_avx512vl(local_118,auVar16);
    if (auVar43._0_8_ <= (mgeo2->Size).m_data[1]) {
      auVar94._8_8_ = 0;
      auVar94._0_8_ = local_130;
      auVar17._8_8_ = 0x7fffffffffffffff;
      auVar17._0_8_ = 0x7fffffffffffffff;
      auVar43 = vandpd_avx512vl(auVar94,auVar17);
      if (auVar43._0_8_ <= (mgeo2->Size).m_data[2]) {
        bVar35 = true;
        if (0.0 <= local_140) {
          auVar105 = ZEXT1664(auVar94);
        }
        else {
          auVar34._8_8_ = 0x8000000000000000;
          auVar34._0_8_ = 0x8000000000000000;
          local_128 = vxorpd_avx512vl(local_128,auVar34);
          auVar105 = ZEXT1664(auVar94);
        }
        goto LAB_008562e5;
      }
    }
  }
  bVar35 = false;
  local_118 = ZEXT816(0);
  local_128 = ZEXT816(0);
LAB_008562e5:
  if (!bVar35) {
    auVar99._8_8_ = 0;
    auVar99._0_8_ = local_138;
    auVar18._8_8_ = 0x7fffffffffffffff;
    auVar18._0_8_ = 0x7fffffffffffffff;
    auVar43 = vandpd_avx512vl(auVar99,auVar18);
    dVar50 = (mgeo2->Size).m_data[1];
    auVar95._8_8_ = 0;
    auVar95._0_8_ = dVar50;
    if ((auVar43._0_8_ <= dVar42 + dVar50) && (dVar41 <= dVar49)) {
      auVar102._8_8_ = 0;
      auVar102._0_8_ = local_130;
      auVar19._8_8_ = 0x7fffffffffffffff;
      auVar19._0_8_ = 0x7fffffffffffffff;
      auVar43 = vandpd_avx512vl(auVar102,auVar19);
      if (auVar43._0_8_ <= (mgeo2->Size).m_data[2]) {
        bVar35 = true;
        local_118 = auVar95;
        if (local_138 < 0.0) {
          auVar20._8_8_ = 0x8000000000000000;
          auVar20._0_8_ = 0x8000000000000000;
          local_118 = vxorpd_avx512vl(auVar95,auVar20);
        }
        auVar105 = ZEXT1664(auVar102);
        local_128 = auVar88;
      }
    }
  }
  if ((!bVar35) && (dVar41 <= dVar49)) {
    auVar100._8_8_ = 0;
    auVar100._0_8_ = local_130;
    auVar31._8_8_ = 0x7fffffffffffffff;
    auVar31._0_8_ = 0x7fffffffffffffff;
    auVar43 = vandpd_avx512vl(auVar100,auVar31);
    dVar50 = (mgeo2->Size).m_data[2];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar50;
    if (auVar43._0_8_ <= dVar42 + dVar50) {
      auVar81._8_8_ = 0;
      auVar81._0_8_ = local_138;
      auVar32._8_8_ = 0x7fffffffffffffff;
      auVar32._0_8_ = 0x7fffffffffffffff;
      auVar43 = vandpd_avx512vl(auVar81,auVar32);
      if (auVar43._0_8_ <= (mgeo2->Size).m_data[1]) {
        bVar35 = true;
        if (local_130 < 0.0) {
          auVar33._8_8_ = 0x8000000000000000;
          auVar33._0_8_ = 0x8000000000000000;
          auVar44 = vxorpd_avx512vl(auVar44,auVar33);
        }
        auVar105 = ZEXT1664(auVar44);
        local_128 = auVar88;
        local_118 = auVar81;
      }
    }
  }
  if (!bVar35) {
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_138;
    auVar21._8_8_ = 0x7fffffffffffffff;
    auVar21._0_8_ = 0x7fffffffffffffff;
    auVar43 = vandpd_avx512vl(auVar75,auVar21);
    dVar42 = auVar43._0_8_ - (mgeo2->Size).m_data[1];
    dVar49 = (dVar41 - dVar49) * (dVar41 - dVar49) + dVar42 * dVar42;
    if (dVar49 < 0.0) {
      dVar49 = sqrt(dVar49);
      auVar105 = ZEXT1664(auVar105._0_16_);
    }
    else {
      auVar61._8_8_ = 0;
      auVar61._0_8_ = dVar49;
      auVar43 = vsqrtsd_avx(auVar61,auVar61);
      dVar49 = auVar43._0_8_;
    }
    if (dVar49 <= mgeo1->rad) {
      auVar62._8_8_ = 0;
      auVar62._0_8_ = local_130;
      auVar22._8_8_ = 0x7fffffffffffffff;
      auVar22._0_8_ = 0x7fffffffffffffff;
      auVar43 = vandpd_avx512vl(auVar62,auVar22);
      if (auVar43._0_8_ <= (mgeo2->Size).m_data[2]) {
        local_128._8_8_ = 0;
        local_128._0_8_ = (mgeo2->Size).m_data[0];
        if (local_140 <= 0.0) {
          auVar30._8_8_ = 0x8000000000000000;
          auVar30._0_8_ = 0x8000000000000000;
          local_128 = vxorpd_avx512vl(local_128,auVar30);
        }
        local_118._8_8_ = 0;
        local_118._0_8_ = (mgeo2->Size).m_data[1];
        bVar35 = true;
        if (local_138 <= 0.0) {
          auVar23._8_8_ = 0x8000000000000000;
          auVar23._0_8_ = 0x8000000000000000;
          local_118 = vxorpd_avx512vl(local_118,auVar23);
        }
        auVar105 = ZEXT1664(auVar62);
      }
    }
  }
  if (!bVar35) {
    auVar63._8_8_ = 0x7fffffffffffffff;
    auVar63._0_8_ = 0x7fffffffffffffff;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = local_138;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = local_130;
    auVar43 = vandpd_avx(auVar76,auVar63);
    dVar49 = auVar43._0_8_ - (mgeo2->Size).m_data[1];
    auVar43 = vandpd_avx(auVar82,auVar63);
    dVar42 = auVar43._0_8_ - (mgeo2->Size).m_data[2];
    dVar49 = dVar49 * dVar49 + dVar42 * dVar42;
    if (dVar49 < 0.0) {
      dVar49 = sqrt(dVar49);
      auVar105 = ZEXT1664(auVar105._0_16_);
    }
    else {
      auVar64._8_8_ = 0;
      auVar64._0_8_ = dVar49;
      auVar43 = vsqrtsd_avx(auVar64,auVar64);
      dVar49 = auVar43._0_8_;
    }
    if (dVar49 <= mgeo1->rad) {
      auVar65._8_8_ = 0;
      auVar65._0_8_ = local_140;
      auVar24._8_8_ = 0x7fffffffffffffff;
      auVar24._0_8_ = 0x7fffffffffffffff;
      auVar43 = vandpd_avx512vl(auVar65,auVar24);
      if (auVar43._0_8_ <= (mgeo2->Size).m_data[0]) {
        local_118._8_8_ = 0;
        local_118._0_8_ = (mgeo2->Size).m_data[1];
        if (local_138 <= 0.0) {
          auVar29._8_8_ = 0x8000000000000000;
          auVar29._0_8_ = 0x8000000000000000;
          local_118 = vxorpd_avx512vl(local_118,auVar29);
        }
        auVar45._8_8_ = 0;
        auVar45._0_8_ = (mgeo2->Size).m_data[2];
        bVar35 = true;
        if (local_130 <= 0.0) {
          auVar25._8_8_ = 0x8000000000000000;
          auVar25._0_8_ = 0x8000000000000000;
          auVar45 = vxorpd_avx512vl(auVar45,auVar25);
        }
        auVar105 = ZEXT1664(auVar45);
        local_128 = auVar65;
      }
    }
  }
  if (!bVar35) {
    auVar66._8_8_ = 0x7fffffffffffffff;
    auVar66._0_8_ = 0x7fffffffffffffff;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_140;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = local_130;
    auVar43 = vandpd_avx(auVar83,auVar66);
    dVar49 = auVar43._0_8_ - (mgeo2->Size).m_data[2];
    auVar43 = vandpd_avx(auVar77,auVar66);
    dVar42 = auVar43._0_8_ - (mgeo2->Size).m_data[0];
    dVar49 = dVar49 * dVar49 + dVar42 * dVar42;
    if (dVar49 < 0.0) {
      dVar49 = sqrt(dVar49);
      auVar105 = ZEXT1664(auVar105._0_16_);
    }
    else {
      auVar67._8_8_ = 0;
      auVar67._0_8_ = dVar49;
      auVar43 = vsqrtsd_avx(auVar67,auVar67);
      dVar49 = auVar43._0_8_;
    }
    if (dVar49 <= mgeo1->rad) {
      auVar68._8_8_ = 0;
      auVar68._0_8_ = local_138;
      auVar26._8_8_ = 0x7fffffffffffffff;
      auVar26._0_8_ = 0x7fffffffffffffff;
      auVar43 = vandpd_avx512vl(auVar68,auVar26);
      if (auVar43._0_8_ <= (mgeo2->Size).m_data[1]) {
        auVar46._8_8_ = 0;
        auVar46._0_8_ = (mgeo2->Size).m_data[2];
        if (local_130 <= 0.0) {
          auVar28._8_8_ = 0x8000000000000000;
          auVar28._0_8_ = 0x8000000000000000;
          auVar46 = vxorpd_avx512vl(auVar46,auVar28);
        }
        auVar105 = ZEXT1664(auVar46);
        local_128._8_8_ = 0;
        local_128._0_8_ = (mgeo2->Size).m_data[0];
        bVar35 = true;
        local_118 = auVar68;
        if (local_140 <= 0.0) {
          auVar27._8_8_ = 0x8000000000000000;
          auVar27._0_8_ = 0x8000000000000000;
          local_128 = vxorpd_avx512vl(local_128,auVar27);
        }
      }
    }
  }
  ipoint = 1;
  do {
    auVar104 = auVar105._0_16_;
    if (bVar35) break;
    geometry::ChBox::GetPn((ChVector<double> *)local_e8,mgeo2,ipoint);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = ((double)local_e8._8_8_ - local_138) * ((double)local_e8._8_8_ - local_138);
    auVar84._8_8_ = 0;
    auVar84._0_8_ = (double)local_e8._0_8_ - local_140;
    auVar43 = vfmadd231sd_fma(auVar69,auVar84,auVar84);
    auVar78._8_8_ = 0;
    auVar78._0_8_ = (double)local_e8._16_8_ - local_130;
    auVar43 = vfmadd231sd_fma(auVar43,auVar78,auVar78);
    if (auVar43._0_8_ < 0.0) {
      dVar49 = sqrt(auVar43._0_8_);
    }
    else {
      auVar43 = vsqrtsd_avx(auVar43,auVar43);
      dVar49 = auVar43._0_8_;
    }
    if (dVar49 <= mgeo1->rad) {
      geometry::ChBox::GetPn((ChVector<double> *)local_e8,mgeo2,ipoint);
      local_128._8_8_ = 0;
      local_128._0_8_ = local_e8._0_8_;
      local_118._8_8_ = 0;
      local_118._0_8_ = local_e8._8_8_;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = local_e8._16_8_;
      bVar35 = true;
    }
    auVar105 = ZEXT1664(auVar104);
    ipoint = ipoint + 1;
  } while (ipoint != 9);
  pVVar40 = local_78;
  pVVar39 = local_80;
  if (bVar35) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar70._8_8_ = 0;
    auVar70._0_8_ =
         (double)local_118._0_8_ *
         (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar43 = vfmadd231sd_fma(auVar70,local_128,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar43 = vfmadd231sd_fma(auVar43,auVar104,auVar2);
    local_70.m_data[0] = auVar43._0_8_ + local_78->m_data[0];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
    auVar79._8_8_ = 0;
    auVar79._0_8_ =
         (double)local_118._0_8_ *
         (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar43 = vfmadd231sd_fma(auVar79,local_128,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
    auVar43 = vfmadd231sd_fma(auVar43,auVar104,auVar4);
    local_70.m_data[1] = auVar43._0_8_ + local_78->m_data[1];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar85._8_8_ = 0;
    auVar85._0_8_ =
         (double)local_118._0_8_ *
         (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar43 = vfmadd231sd_fma(auVar85,local_128,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (R2->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar43 = vfmadd231sd_fma(auVar43,auVar104,auVar6);
    local_70.m_data[2] = auVar43._0_8_ + local_78->m_data[2];
    dVar49 = local_70.m_data[0] - local_80->m_data[0];
    dVar42 = local_70.m_data[1] - local_80->m_data[1];
    dVar41 = local_70.m_data[2] - local_80->m_data[2];
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar42 * dVar42;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = dVar49;
    auVar43 = vfmadd231sd_fma(auVar71,auVar93,auVar93);
    auVar101._8_8_ = 0;
    auVar101._0_8_ = dVar41;
    auVar43 = vfmadd231sd_fma(auVar43,auVar101,auVar101);
    if (auVar43._0_8_ < 0.0) {
      dVar50 = sqrt(auVar43._0_8_);
    }
    else {
      auVar43 = vsqrtsd_avx(auVar43,auVar43);
      dVar50 = auVar43._0_8_;
    }
    bVar35 = 2.2250738585072014e-308 <= dVar50;
    dVar50 = 1.0 / dVar50;
    dVar42 = (double)((ulong)bVar35 * (long)(dVar42 * dVar50));
    auVar47._0_8_ = (ulong)bVar35 * (long)(dVar49 * dVar50) + (ulong)!bVar35 * 0x3ff0000000000000;
    auVar47._8_8_ = 0;
    uVar7 = (ulong)bVar35 * (long)(dVar41 * dVar50);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar7;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = pVVar40->m_data[0] - pVVar39->m_data[0];
    auVar96._8_8_ = 0;
    auVar96._0_8_ = dVar42 * (pVVar40->m_data[1] - pVVar39->m_data[1]);
    auVar43 = vfmadd231sd_fma(auVar96,auVar47,auVar86);
    auVar103._8_8_ = 0;
    auVar103._0_8_ = pVVar40->m_data[2] - pVVar39->m_data[2];
    auVar43 = vfmadd231sd_fma(auVar43,auVar48,auVar103);
    bVar35 = auVar43._0_8_ < 0.0;
    dVar41 = (double)((ulong)bVar35 * (uVar7 ^ 0x8000000000000000) + !bVar35 * uVar7);
    dVar42 = (double)((ulong)bVar35 * (long)-dVar42 + (ulong)!bVar35 * (long)dVar42);
    dVar50 = (double)((ulong)bVar35 * (auVar47._0_8_ ^ 0x8000000000000000) + !bVar35 * auVar47._0_8_
                     );
    dVar49 = mgeo1->rad;
    local_48.m_data[0] = pVVar39->m_data[0] + dVar49 * dVar50;
    local_48.m_data[1] = pVVar39->m_data[1] + dVar49 * dVar42;
    local_48.m_data[2] = pVVar39->m_data[2] + dVar49 * dVar41;
    local_54.m_data[0] = (float)dVar50;
    local_54.m_data[1] = (float)dVar42;
    local_54.m_data[2] = (float)dVar41;
    local_e8._16_8_ = 0.0;
    local_e8._24_8_ = 0.0;
    local_e8._32_8_ = 0.0;
    fStack_c0 = 0.0;
    uStack_bc = 0;
    local_b8 = 0.0;
    dStack_b0 = 0.0;
    local_a8 = 0.0;
    local_a0 = 0.0;
    local_a4 = fStack_c0;
    ChCollisionPair::Set
              ((ChCollisionPair *)local_e8,&mgeo1->super_ChGeometry,(ChGeometry *)mgeo2,&local_48,
               &local_70,&local_54,(float *)0x0);
    uVar38 = local_e8._32_8_;
    uVar37 = local_e8._24_8_;
    uVar36 = local_e8._0_8_;
    if (swap_pairs) {
      local_e8._0_8_ = local_e8._8_8_;
      local_e8._8_8_ = uVar36;
      dVar49 = (double)CONCAT44(uStack_bc,fStack_c0);
      local_e8._24_8_ = local_b8;
      local_e8._32_8_ = dStack_b0;
      fStack_c0 = (float)local_e8._16_8_;
      uStack_bc = SUB84(local_e8._16_8_,4);
      local_b8 = (double)uVar37;
      dStack_b0 = (double)uVar38;
      local_a0 = -local_a0;
      local_a4 = -local_a4;
      local_a8 = -local_a8;
      local_e8._16_8_ = dVar49;
    }
    ChNarrowPhaseCollider::AddCollisionPair(mcollider,(ChCollisionPair *)local_e8);
  }
  return 0;
}

Assistant:

int ChGeometryCollider::ComputeSphereBoxCollisions(
    geometry::ChSphere& mgeo1,         ///< sphere
    Vector* c1,                        ///< absolute position of center
    geometry::ChBox& mgeo2,            ///< box
    ChMatrix33<>* R2,                  ///< absolute rotation of 2nd model (with box)
    Vector* T2,                        ///< absolute position of 2nd model (with box)
    ChNarrowPhaseCollider& mcollider,  ///< reference to a collider to store contacts into
    bool just_intersection,  ///< if true, just report if intersecting (no further calculus on normal, depht, etc.)
    bool swap_pairs          ///< if true, pairs are reported as Triangle-Sphere (triangle will be the main ref.)
) {
    Vector relC = ChTransform<>::TransformParentToLocal(*c1, *T2, *R2);

    if (just_intersection) {
        if (((fabs(relC.x()) <= mgeo2.Size.x() + mgeo1.rad) && (fabs(relC.y()) <= mgeo2.Size.y()) &&
             (fabs(relC.z()) <= mgeo2.Size.z())) ||
            ((fabs(relC.y()) <= mgeo2.Size.y() + mgeo1.rad) && (fabs(relC.x()) <= mgeo2.Size.x()) &&
             (fabs(relC.z()) <= mgeo2.Size.z())) ||
            ((fabs(relC.z()) <= mgeo2.Size.z() + mgeo1.rad) && (fabs(relC.x()) <= mgeo2.Size.x()) &&
             (fabs(relC.y()) <= mgeo2.Size.y())) ||
            ((sqrt(pow(fabs(relC.x()) - mgeo2.Size.x(), 2) + pow(fabs(relC.y()) - mgeo2.Size.y(), 2)) <= mgeo1.rad) &&
             (fabs(relC.z()) <= mgeo2.Size.z())) ||
            ((sqrt(pow(fabs(relC.y()) - mgeo2.Size.y(), 2) + pow(fabs(relC.z()) - mgeo2.Size.z(), 2)) <= mgeo1.rad) &&
             (fabs(relC.x()) <= mgeo2.Size.x())) ||
            ((sqrt(pow(fabs(relC.z()) - mgeo2.Size.z(), 2) + pow(fabs(relC.x()) - mgeo2.Size.x(), 2)) <= mgeo1.rad) &&
             (fabs(relC.y()) <= mgeo2.Size.y())) ||
            ((sqrt(pow(fabs(relC.x()) - mgeo2.Size.x(), 2) + pow(fabs(relC.y()) - mgeo2.Size.y(), 2) +
                   pow(fabs(relC.z()) - mgeo2.Size.z(), 2)) <= mgeo1.rad))) {
            ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2);

            mcollider.AddCollisionPair(&temp);
            return 1;
        }
    } else {
        Vector pt_loc;
        bool done = false;

        if ((fabs(relC.x()) <= mgeo2.Size.x() + mgeo1.rad) && (fabs(relC.y()) <= mgeo2.Size.y()) &&
            (fabs(relC.z()) <= mgeo2.Size.z())) {
            if (relC.x() >= 0) {
                pt_loc = relC;
                pt_loc.x() = mgeo2.Size.x();
                done = true;
            } else {
                pt_loc = relC;
                pt_loc.x() = -mgeo2.Size.x();
                done = true;
            }
        }
        if (!done) {
            if ((fabs(relC.y()) <= mgeo2.Size.y() + mgeo1.rad) && (fabs(relC.z()) <= mgeo2.Size.z()) &&
                (fabs(relC.x()) <= mgeo2.Size.x())) {
                if (relC.y() >= 0) {
                    pt_loc = relC;
                    pt_loc.y() = mgeo2.Size.y();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.y() = -mgeo2.Size.y();
                    done = true;
                }
            }
        }
        if (!done) {
            if ((fabs(relC.z()) <= mgeo2.Size.z() + mgeo1.rad) && (fabs(relC.x()) <= mgeo2.Size.x()) &&
                (fabs(relC.y()) <= mgeo2.Size.y())) {
                if (relC.z() >= 0) {
                    pt_loc = relC;
                    pt_loc.z() = mgeo2.Size.z();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.z() = -mgeo2.Size.z();
                    done = true;
                }
            }
        }
        if (!done) {
            if ((sqrt(pow(fabs(relC.x()) - mgeo2.Size.x(), 2) + pow(fabs(relC.y()) - mgeo2.Size.y(), 2)) <=
                 mgeo1.rad) &&
                (fabs(relC.z()) <= mgeo2.Size.z())) {
                if (relC.x() > 0) {
                    if (relC.y() > 0) {
                        pt_loc = relC;
                        pt_loc.x() = mgeo2.Size.x();
                        pt_loc.y() = mgeo2.Size.y();
                        done = true;
                    } else {
                        pt_loc = relC;
                        pt_loc.x() = mgeo2.Size.x();
                        pt_loc.y() = -mgeo2.Size.y();
                        done = true;
                    }
                } else if (relC.y() > 0) {
                    pt_loc = relC;
                    pt_loc.x() = -mgeo2.Size.x();
                    pt_loc.y() = mgeo2.Size.y();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.x() = -mgeo2.Size.x();
                    pt_loc.y() = -mgeo2.Size.y();
                    done = true;
                }
            }
        }
        if (!done) {
            if ((sqrt(pow(fabs(relC.y()) - mgeo2.Size.y(), 2) + pow(fabs(relC.z()) - mgeo2.Size.z(), 2)) <=
                 mgeo1.rad) &&
                (fabs(relC.x()) <= mgeo2.Size.x())) {
                if (relC.y() > 0) {
                    if (relC.z() > 0) {
                        pt_loc = relC;
                        pt_loc.y() = mgeo2.Size.y();
                        pt_loc.z() = mgeo2.Size.z();
                        done = true;
                    } else {
                        pt_loc = relC;
                        pt_loc.y() = mgeo2.Size.y();
                        pt_loc.z() = -mgeo2.Size.z();
                        done = true;
                    }
                } else if (relC.z() > 0) {
                    pt_loc = relC;
                    pt_loc.y() = -mgeo2.Size.y();
                    pt_loc.z() = mgeo2.Size.z();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.y() = -mgeo2.Size.y();
                    pt_loc.z() = -mgeo2.Size.z();
                    done = true;
                }
            }
        }
        if (!done) {
            if ((sqrt(pow(fabs(relC.z()) - mgeo2.Size.z(), 2) + pow(fabs(relC.x()) - mgeo2.Size.x(), 2)) <=
                 mgeo1.rad) &&
                (fabs(relC.y()) <= mgeo2.Size.y())) {
                if (relC.z() > 0) {
                    if (relC.x() > 0) {
                        pt_loc = relC;
                        pt_loc.z() = mgeo2.Size.z();
                        pt_loc.x() = mgeo2.Size.x();
                        done = true;
                    } else {
                        pt_loc = relC;
                        pt_loc.z() = mgeo2.Size.z();
                        pt_loc.x() = -mgeo2.Size.x();
                        done = true;
                    }
                } else if (relC.x() > 0) {
                    pt_loc = relC;
                    pt_loc.z() = -mgeo2.Size.z();
                    pt_loc.x() = mgeo2.Size.x();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.z() = -mgeo2.Size.z();
                    pt_loc.x() = -mgeo2.Size.x();
                    done = true;
                }
            }
        }
        for (int i = 1; i <= 8; i++) {
            if (done)
                break;
            if (Vlength(mgeo2.GetPn(i) - relC) <= mgeo1.rad) {
                pt_loc = mgeo2.GetPn(i);
                done = true;
            }
        }

        if (done) {
            Vector pt_2 = ChTransform<>::TransformLocalToParent(pt_loc, *T2, *R2);
            Vector mnormal = Vnorm(pt_2 - *c1);
            if (Vdot(mnormal, *T2 - *c1) < 0)
                mnormal = -mnormal;
            Vector pt_1 = *c1 + (mnormal * mgeo1.rad);
            ChCollisionPair mcoll(&mgeo1, &mgeo2,  // geometries
                                  pt_1,            // p1
                                  pt_2,            // p2
                                  mnormal          // normal
            );
            if (swap_pairs)
                mcoll.SwapGeometries();
            mcollider.AddCollisionPair(&mcoll);
        }
    }

    return 0;
}